

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::ebml_read_sint(MatroskaDemuxer *this,uint32_t *id,int64_t *num)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  uint uVar5;
  ulong uVar6;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  int64_t size;
  ostringstream ss;
  
  iVar1 = ebml_read_element_id(this,id,(int *)0x0);
  if (-1 < iVar1) {
    iVar1 = ebml_read_element_length(this,&size);
    if (-1 < iVar1) {
      if (size - 9U < 0xfffffffffffffff8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Invalid sint element size ");
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        poVar3 = std::operator<<(poVar3," at position ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar4 = 900;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
        if (local_1d0 == &local_1c0) {
          puVar4[6] = local_1c0;
          puVar4[7] = uStack_1bc;
          puVar4[8] = uStack_1b8;
          puVar4[9] = uStack_1b4;
        }
        else {
          *(uint **)(puVar4 + 2) = local_1d0;
          *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1bc,local_1c0);
        }
        *(undefined8 *)(puVar4 + 4) = local_1c8;
        local_1c0 = local_1c0 & 0xffffff00;
        __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      iVar2 = IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
      uVar6 = (long)iVar2 & 0xffffffffffffff7f;
      uVar5 = 1;
      while( true ) {
        *num = uVar6;
        if ((uint)size <= uVar5) break;
        uVar5 = uVar5 + 1;
        iVar1 = IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
        uVar6 = uVar6 << 8 | (long)iVar1;
      }
      iVar1 = 0;
      if ((char)iVar2 < '\0') {
        *num = uVar6 + (-1L << ((char)((uint)size << 3) - 1U & 0x3f));
      }
    }
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::ebml_read_sint(uint32_t *id, int64_t *num)
{
    unsigned n = 1;
    int negative = 0, res;
    int64_t size;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&size)) < 0)
        return res;
    if (size < 1 || size > 8)
    {
        const offset_t pos = m_processedBytes;
        THROW(ERR_MATROSKA_PARSE, "Invalid sint element size " << size << " at position " << pos)
    }
    if ((*num = get_byte()) & 0x80)
    {
        negative = 1;
        *num &= ~0x80;
    }
    while (n++ < size) *num = *num << 8 | get_byte();

    /* make signed */
    if (negative)
        *num = *num - (1LL << (8 * size - 1));

    return 0;
}